

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

void __thiscall
slang::parsing::Lexer::scanDisabledRegion
          (Lexer *this,string_view firstWord,string_view secondWord,
          optional<std::basic_string_view<char,_std::char_traits<char>_>_> thirdWord,
          DiagCode unclosedDiag)

{
  size_type *psVar1;
  byte bVar2;
  size_t sVar3;
  char *pcVar4;
  Diagnostic *this_00;
  char cVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  
  sVar7 = firstWord._M_len;
  sVar6 = secondWord._M_len;
  pcVar4 = this->sourceBuffer;
  cVar5 = *pcVar4;
  if (cVar5 != '\0' || pcVar4 < this->sourceEnd + -1) {
    do {
      this->sourceBuffer = pcVar4 + 1;
      if ((cVar5 == '/') && ((cVar5 = pcVar4[1], cVar5 == '/' || (cVar5 == '*')))) {
        pcVar4 = pcVar4 + 2;
        while( true ) {
          this->sourceBuffer = pcVar4;
          if ((*pcVar4 != ' ') && (*pcVar4 != '\t')) break;
          pcVar4 = pcVar4 + 1;
        }
        if (sVar7 == 0) {
LAB_0039c298:
          bVar2 = *this->sourceBuffer;
          if ((bVar2 == 0) || ((bVar2 < 0x21 & (byte)(0x100003e00 >> (bVar2 & 0x3f))) != 0)) {
            pcVar4 = this->sourceBuffer;
            while( true ) {
              if ((*pcVar4 != ' ') && (*pcVar4 != '\t')) break;
              this->sourceBuffer = pcVar4 + 1;
              pcVar4 = pcVar4 + 1;
            }
            if (sVar6 == 0) {
LAB_0039c311:
              bVar2 = *this->sourceBuffer;
              if ((bVar2 == 0) || ((bVar2 < 0x21 & (byte)(0x100003e00 >> (bVar2 & 0x3f))) != 0)) {
                if (((undefined1  [24])
                     thirdWord.
                     super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                    & (undefined1  [24])0x1) == (undefined1  [24])0x0) goto LAB_0039c413;
                pcVar4 = this->sourceBuffer;
                while( true ) {
                  if ((*pcVar4 != ' ') && (*pcVar4 != '\t')) break;
                  this->sourceBuffer = pcVar4 + 1;
                  pcVar4 = pcVar4 + 1;
                }
                if (thirdWord.
                    super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                    ._M_payload.
                    super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                    ._M_payload._M_value._M_len == 0) {
LAB_0039c38a:
                  bVar2 = *this->sourceBuffer;
                  if ((bVar2 == 0) || ((bVar2 < 0x21 & (byte)(0x100003e00 >> (bVar2 & 0x3f))) != 0))
                  {
LAB_0039c413:
                    if (cVar5 == '*') {
                      scanBlockComment(this);
                    }
                    else {
                      scanLineComment(this);
                    }
                    psVar1 = &(this->triviaBuffer).super_SmallVectorBase<slang::parsing::Trivia>.len
                    ;
                    *psVar1 = *psVar1 - 1;
                    return;
                  }
                }
                else {
                  pcVar4 = this->sourceBuffer;
                  if (*pcVar4 ==
                      *thirdWord.
                       super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                       ._M_payload.
                       super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                       ._M_payload._M_value._M_str) {
                    sVar3 = 1;
                    do {
                      sVar9 = sVar3;
                      pcVar8 = pcVar4 + sVar9;
                      this->sourceBuffer = pcVar8;
                      if (thirdWord.
                          super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                          ._M_payload.
                          super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                          ._M_payload._M_value._M_len == sVar9) goto LAB_0039c38a;
                      sVar3 = sVar9 + 1;
                    } while (*pcVar8 ==
                             thirdWord.
                             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                             ._M_payload._M_value._M_str[sVar9]);
                    if (thirdWord.
                        super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                        ._M_payload._M_value._M_len == sVar9) goto LAB_0039c38a;
                  }
                }
              }
            }
            else {
              pcVar4 = this->sourceBuffer;
              if (*pcVar4 == *secondWord._M_str) {
                sVar3 = 1;
                do {
                  sVar9 = sVar3;
                  pcVar8 = pcVar4 + sVar9;
                  this->sourceBuffer = pcVar8;
                  if (sVar6 == sVar9) goto LAB_0039c311;
                  sVar3 = sVar9 + 1;
                } while (*pcVar8 == secondWord._M_str[sVar9]);
                if (sVar6 == sVar9) goto LAB_0039c311;
              }
            }
          }
        }
        else {
          pcVar4 = this->sourceBuffer;
          if (*pcVar4 == *firstWord._M_str) {
            sVar3 = 1;
            do {
              sVar9 = sVar3;
              pcVar8 = pcVar4 + sVar9;
              this->sourceBuffer = pcVar8;
              if (sVar7 == sVar9) goto LAB_0039c298;
              sVar3 = sVar9 + 1;
            } while (*pcVar8 == firstWord._M_str[sVar9]);
            if (sVar7 == sVar9) goto LAB_0039c298;
          }
        }
      }
      pcVar4 = this->sourceBuffer;
      cVar5 = *pcVar4;
    } while (cVar5 != '\0' || pcVar4 < this->sourceEnd + -1);
  }
  this_00 = Diagnostics::add(this->diagnostics,unclosedDiag,
                             (SourceLocation)
                             (((long)pcVar4 -
                              (long)(this->originalBegin +
                                    (uint)((int)pcVar4 - *(int *)&this->marker))) * 0x10000000 |
                             (ulong)((this->bufferId).id & 0xfffffff)));
  if (unclosedDiag != (DiagCode)0x100002) {
    return;
  }
  Diagnostic::operator<<(this_00,secondWord);
  return;
}

Assistant:

void Lexer::scanDisabledRegion(std::string_view firstWord, std::string_view secondWord,
                               std::optional<std::string_view> thirdWord, DiagCode unclosedDiag) {
    auto matchWord = [&](std::string_view word) {
        while (isTabOrSpace(peek()))
            advance();

        for (char c : word) {
            if (!consume(c))
                return false;
        }

        char c = peek();
        return isWhitespace(c) || c == '\0';
    };

    while (true) {
        char c = peek();
        if (c == '\0' && reallyAtEnd()) {
            auto& diag = addDiag(unclosedDiag, currentOffset() - lexemeLength());
            if (unclosedDiag == diag::UnclosedTranslateOff)
                diag << secondWord;
            return;
        }

        advance();
        if (c == '/' && (peek() == '/' || peek() == '*')) {
            const bool isBlockComment = peek() == '*';
            advance();

            if (matchWord(firstWord) && matchWord(secondWord)) {
                if (!thirdWord || matchWord(*thirdWord)) {
                    // Scan the rest of the comment and then return.
                    // We discard the comment trivia from the buffer
                    // so that this part of the region ends up as
                    // a DisabledText trivia instead.
                    if (isBlockComment)
                        scanBlockComment();
                    else
                        scanLineComment();
                    triviaBuffer.pop_back();
                    return;
                }
            }
        }
    }
}